

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.h
# Opt level: O0

uchar CRC::Finalize<unsigned_char,(unsigned_short)8>
                (uchar remainder,uchar finalXOR,bool reflectOutput)

{
  ulong uVar1;
  long lVar2;
  uchar uVar3;
  undefined1 in_DL;
  undefined1 in_SIL;
  undefined1 in_DIL;
  undefined8 uStack_8;
  
  uVar1 = (ulong)CONCAT21(CONCAT11(in_DIL,in_SIL),in_DL) & 0xffff01;
  uStack_8 = uVar1 << 0x28;
  lVar2 = uStack_8;
  uStack_8._6_2_ = (undefined2)(uVar1 >> 8);
  uStack_8._5_1_ = (char)uVar1;
  if (uStack_8._5_1_ != '\0') {
    uStack_8._7_1_ = (byte)(uVar1 >> 0x10);
    uVar3 = Reflect<unsigned_char>(uStack_8._7_1_,8);
    uStack_8 = CONCAT17(uVar3,(int7)lVar2);
  }
  return uStack_8._7_1_ ^ uStack_8._6_1_;
}

Assistant:

inline CRCType CRC::Finalize(CRCType remainder, CRCType finalXOR, bool reflectOutput)
{
    // For masking off the bits for the CRC (in the event that the number of bits in CRCType is larger than CRCWidth)
    static crcpp_constexpr CRCType BIT_MASK = (CRCType(1) << (CRCWidth - CRCType(1))) |
                                             ((CRCType(1) << (CRCWidth - CRCType(1))) - CRCType(1));

    if (reflectOutput)
    {
        remainder = Reflect(remainder, CRCWidth);
    }

    return (remainder ^ finalXOR) & BIT_MASK;
}